

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

KeyValue *
google::protobuf::internal::ExtensionSet::AllocateFlatMap
          (Arena *arena,uint16_t powerof2_flat_capacity)

{
  type_conflict tVar1;
  LogMessage *pLVar2;
  KeyValue *pKVar3;
  LogMessage local_28;
  Voidify local_13;
  ushort local_12;
  Arena *pAStack_10;
  uint16_t powerof2_flat_capacity_local;
  Arena *arena_local;
  
  local_12 = powerof2_flat_capacity;
  pAStack_10 = arena;
  tVar1 = absl::lts_20250127::has_single_bit<unsigned_short>(powerof2_flat_capacity);
  if (((tVar1 ^ 0xffU) & 1) == 0) {
    pKVar3 = Arena::CreateArray<google::protobuf::internal::ExtensionSet::KeyValue>
                       (pAStack_10,(ulong)local_12);
    return pKVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,200,"absl::has_single_bit(powerof2_flat_capacity)");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_13,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

ExtensionSet::KeyValue* ExtensionSet::AllocateFlatMap(
    Arena* arena, uint16_t powerof2_flat_capacity) {
  // It is important to allocate power-of-2 bytes in order to reuse
  // allocated blocks in arena for ExtensionSet and RepeatedFields.
  // ReturnArrayMemory is also more efficient with power-of-2 bytes, and
  // sizeof(KeyValue) is a power-of-2 on 64-bit platforms.
  static_assert(absl::has_single_bit(sizeof(KeyValue)) || sizeof(void*) != 8,
                "sizeof(KeyValue) must be a power of 2");
  ABSL_DCHECK(absl::has_single_bit(powerof2_flat_capacity));
  return Arena::CreateArray<ExtensionSet::KeyValue>(arena,
                                                    powerof2_flat_capacity);
}